

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O2

string * __thiscall
antlr::Parser::getFilename_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&((this->inputState).ref)->ptr->filename);
  return __return_storage_ptr__;
}

Assistant:

string getFilename() const
	{
		return inputState->filename;
	}